

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O3

void __thiscall QSortFilterProxyModel::setSortRole(QSortFilterProxyModel *this,int role)

{
  QSortFilterProxyModelPrivate *this_00;
  
  this_00 = *(QSortFilterProxyModelPrivate **)(this + 8);
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper(&this_00->sort_role);
  if ((this_00->sort_role).super_QPropertyData<int>.val == role) {
    return;
  }
  (this_00->sort_role).super_QPropertyData<int>.val = role;
  QSortFilterProxyModelPrivate::sort(this_00);
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>
  ::notify(&this_00->sort_role);
  return;
}

Assistant:

void QSortFilterProxyModel::setSortRole(int role)
{
    Q_D(QSortFilterProxyModel);
    d->sort_role.removeBindingUnlessInWrapper();
    if (d->sort_role.valueBypassingBindings() == role)
        return;
    d->sort_role.setValueBypassingBindings(role);
    d->sort();
    d->sort_role.notify(); // also emits a signal
}